

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O2

void write_tga_24bit(uint8_t *pixels,uint32_t width,uint32_t height,FILE *fout)

{
  uint uVar1;
  tga_image_header image_header;
  tga_file_header file_header;
  
  file_header.origin_x = 0;
  file_header.origin_y = 0;
  file_header.id_length = '\0';
  file_header.color_map_type = '\0';
  file_header.image_type = '\x02';
  file_header.first_entry_index = 0;
  file_header.color_map_length = 0;
  file_header.color_map_entry_size = '\0';
  image_header.image_width = (uint16_t)width;
  image_header.image_height = (uint16_t)height;
  image_header.pixel_depth = '\x18';
  image_header.pixel_descriptor = '\0';
  fwrite(&file_header,0xc,1,(FILE *)fout);
  fwrite(&image_header,6,1,(FILE *)fout);
  for (uVar1 = 2; uVar1 - 2 < width * height * 3; uVar1 = uVar1 + 3) {
    fputc((int)(char)pixels[uVar1],(FILE *)fout);
    fputc((int)(char)pixels[uVar1 - 1],(FILE *)fout);
    fputc((int)(char)pixels[uVar1 - 2],(FILE *)fout);
  }
  return;
}

Assistant:

void write_tga_24bit(const uint8_t* pixels, uint32_t width, uint32_t height, FILE* fout) {
    #pragma pack(push, 1)
    #pragma pack(1)
    struct tga_file_header {
        uint8_t  id_length;
        uint8_t  color_map_type;
        uint8_t  image_type;
        uint16_t first_entry_index;
        uint16_t color_map_length;
        uint8_t  color_map_entry_size;
        uint16_t origin_x;
        uint16_t origin_y;
    };
    struct tga_image_header {
        uint16_t image_width;
        uint16_t image_height;
        uint8_t  pixel_depth;
        uint8_t  pixel_descriptor;
    };
    #pragma pack(pop)
    tga_file_header  file_header = {0, 0, 2, 0, 0, 0, 0, 0 };
    tga_image_header image_header = { (uint16_t)width, (uint16_t)height, 24, 0 };
    fwrite(&file_header, sizeof(file_header), 1, fout);
    fwrite(&image_header, sizeof(image_header), 1, fout);
    // input is R,G,B, but we write in B,G,R order. This is a super slow implementation
    // that writes a byte at a time to the file, but whatever...
    uint32_t image_size = width * height * 3;
    for (uint32_t i = 0; i < image_size; i += 3) {
        fwrite(&pixels[i+2], 1, 1, fout);
        fwrite(&pixels[i+1], 1, 1, fout);
        fwrite(&pixels[i+0], 1, 1, fout);
    }
}